

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<float_*,_10>::TPZManVector
          (TPZManVector<float_*,_10> *this,initializer_list<float_*> *list)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  const_iterator ppfVar5;
  initializer_list<float_*> *in_RSI;
  TPZVec<float_*> *in_RDI;
  const_iterator it;
  float **aux;
  const_iterator it_end;
  int size;
  initializer_list<float_*> *in_stack_ffffffffffffffb0;
  const_iterator local_40;
  float **local_38;
  
  TPZVec<float_*>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_023d9e48;
  sVar3 = std::initializer_list<float_*>::size(in_RSI);
  iVar2 = (int)sVar3;
  if (iVar2 < 0xb) {
    in_RDI->fStore = (float **)(in_RDI + 1);
    in_RDI->fNElements = (long)iVar2;
    in_RDI->fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    in_stack_ffffffffffffffb0 = (initializer_list<float_*> *)operator_new__(uVar4);
    in_RDI->fStore = (float **)in_stack_ffffffffffffffb0;
    in_RDI->fNElements = (long)iVar2;
    in_RDI->fNAlloc = (long)iVar2;
  }
  ppfVar5 = std::initializer_list<float_*>::end(in_stack_ffffffffffffffb0);
  local_38 = in_RDI->fStore;
  for (local_40 = std::initializer_list<float_*>::begin(in_RSI); local_40 != ppfVar5;
      local_40 = local_40 + 1) {
    *local_38 = *local_40;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const std::initializer_list<T>& list)
{
	int size = list.size();
//	std::cout << "init pzmanvec" << std::endl;
	if (size <= (int64_t)(sizeof(fExtAlloc) / sizeof(T))) {
		// Needed to make TPZVec::operator[] work properly.
		this->fStore = fExtAlloc;
		this->fNElements = size;
		// No memory was allocated by the constructor.
		this->fNAlloc = 0;
	}
	else // The size requested is bigger than the size already provided.
	{
		// Executes the allocation that would be done by TPZVec<T>(size).
		this->fStore = new T[size];
		this->fNElements = size;
		this->fNAlloc = size;
	}

	auto it_end = list.end();
	T* aux = this->fStore;
	for (auto it = list.begin(); it != it_end; it++, aux++)
		*aux = *it;
}